

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall CVmFormatter::write_tab(CVmFormatter *this,int indent,int multiple)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  os_color_t oVar5;
  undefined4 uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  char buf [40];
  char acStack_48 [48];
  
  if ((this->field_0xef81 & 0x40) == 0) {
    if (multiple == 0) {
      if (indent != 0) {
        iVar10 = (*this->_vptr_CVmFormatter[0xe])(this);
        iVar7 = this->linecol_;
        while ((bVar11 = indent != 0, indent = indent + -1, bVar11 && (iVar7 < iVar10))) {
          this->linebuf_[this->linepos_] = L' ';
          this->flagbuf_[this->linepos_] = this->cur_flags_;
          iVar7 = this->linepos_;
          uVar6 = *(undefined4 *)&(this->cur_color_).field_0x14;
          this->colorbuf_[iVar7].attr = (this->cur_color_).attr;
          *(undefined4 *)&this->colorbuf_[iVar7].field_0x14 = uVar6;
          oVar5 = (this->cur_color_).bg;
          this->colorbuf_[iVar7].fg = (this->cur_color_).fg;
          this->colorbuf_[iVar7].bg = oVar5;
          uVar2 = this->linepos_;
          uVar3 = this->linecol_;
          iVar7 = uVar3 + 1;
          this->linepos_ = uVar2 + 1;
          this->linecol_ = iVar7;
        }
      }
    }
    else {
      iVar7 = (*this->_vptr_CVmFormatter[0xe])(this);
      if (this->linecol_ < iVar7) {
        iVar10 = this->linepos_;
        do {
          this->linebuf_[iVar10] = L' ';
          this->flagbuf_[this->linepos_] = this->cur_flags_;
          iVar10 = this->linepos_;
          uVar6 = *(undefined4 *)&(this->cur_color_).field_0x14;
          this->colorbuf_[iVar10].attr = (this->cur_color_).attr;
          *(undefined4 *)&this->colorbuf_[iVar10].field_0x14 = uVar6;
          oVar5 = (this->cur_color_).bg;
          this->colorbuf_[iVar10].fg = (this->cur_color_).fg;
          this->colorbuf_[iVar10].bg = oVar5;
          iVar4 = this->linecol_;
          iVar10 = this->linepos_ + 1;
          this->linepos_ = iVar10;
          iVar1 = iVar4 + 1;
          this->linecol_ = iVar1;
          if ((iVar4 + 2) % multiple == 0) {
            return;
          }
        } while (iVar1 < iVar7);
      }
    }
  }
  else {
    pcVar8 = "INDENT";
    if (indent == 0) {
      pcVar8 = "MULTIPLE";
    }
    uVar9 = (ulong)(uint)multiple;
    if (indent != 0) {
      uVar9 = (ulong)(uint)indent;
    }
    sprintf(acStack_48,"<TAB %s=%d>",pcVar8,uVar9);
    buffer_string(this,acStack_48);
  }
  return;
}

Assistant:

void CVmFormatter::write_tab(VMG_ int indent, int multiple)
{
    int maxcol;

    /* check to see what the underlying system is expecting */
    if (html_target_)
    {
        char buf[40];

        /* 
         *   the underlying system is HTML - generate an appropriate <TAB>
         *   sequence to produce the desired effect 
         */
        sprintf(buf, "<TAB %s=%d>",
                indent != 0 ? "INDENT" : "MULTIPLE",
                indent != 0 ? indent : multiple);
            
        /* write it out */
        buffer_string(vmg_ buf);
    }
    else if (multiple != 0)
    {
        /* get the maximum column */
        maxcol = get_buffer_maxcol();

        /*
         *   We don't have an HTML target, and we have a tab to an every-N
         *   stop: expand the tab with spaces.  Keep going until we reach
         *   the next tab stop of the given multiple.  
         */
        do
        {
            /* stop if we've reached the maximum column */
            if (linecol_ >= maxcol)
                break;

            /* add another space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cur_flags_;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer */
            ++linepos_;

            /* advance the column counter */
            ++linecol_;
        } while ((linecol_ + 1) % multiple != 0);
    }
    else if (indent != 0)
    {
        /* 
         *   We don't have an HTML target, and we just want to add a given
         *   number of spaces.  Simply write out the given number of spaces,
         *   up to our maximum column limit.  
         */
        for (maxcol = get_buffer_maxcol() ;
             indent != 0 && linecol_ < maxcol ; --indent)
        {
            /* add another space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cur_flags_;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer and one column */
            ++linepos_;
            ++linecol_;
        }
    }
}